

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStructUnPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  reference ppFVar2;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  FieldDef *local_110;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_100;
  const_iterator it;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  IdlNamer::Type_abi_cxx11_(&local_c8,&this->namer_,struct_def);
  std::operator+(&local_a8,"func (rcv *",&local_c8);
  std::operator+(&local_88,&local_a8,") UnPackTo(t *");
  NativeName_abi_cxx11_((string *)&it,this,(StructDef *)code_ptr_local);
  std::operator+(&local_68,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
  std::operator+(&local_48,&local_68,") {\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_100._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       ((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_100,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_100);
    local_110 = *ppFVar2;
    if ((local_110->value).type.base_type == BASE_TYPE_STRUCT) {
      IdlNamer::Field_abi_cxx11_(&local_1b0,&this->namer_,local_110);
      std::operator+(&local_190,"\tt.",&local_1b0);
      std::operator+(&local_170,&local_190," = rcv.");
      Namer::Method<flatbuffers::FieldDef>(&local_1d0,&(this->namer_).super_Namer,local_110);
      std::operator+(&local_150,&local_170,&local_1d0);
      std::operator+(&local_130,&local_150,"(nil).UnPack()\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    else {
      IdlNamer::Field_abi_cxx11_(&local_270,&this->namer_,local_110);
      std::operator+(&local_250,"\tt.",&local_270);
      std::operator+(&local_230,&local_250," = rcv.");
      Namer::Method<flatbuffers::FieldDef>(&local_290,&(this->namer_).super_Namer,local_110);
      std::operator+(&local_210,&local_230,&local_290);
      std::operator+(&local_1f0,&local_210,"()\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_100);
  }
  std::__cxx11::string::operator+=((string *)local_28,"}\n\n");
  IdlNamer::Type_abi_cxx11_(&local_330,&this->namer_,(StructDef *)code_ptr_local);
  std::operator+(&local_310,"func (rcv *",&local_330);
  std::operator+(&local_2f0,&local_310,") UnPack() *");
  NativeName_abi_cxx11_(&local_350,this,(StructDef *)code_ptr_local);
  std::operator+(&local_2d0,&local_2f0,&local_350);
  std::operator+(&local_2b0,&local_2d0," {\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::operator+=((string *)local_28,"\tif rcv == nil {\n\t\treturn nil\n\t}\n");
  NativeName_abi_cxx11_(&local_3b0,this,(StructDef *)code_ptr_local);
  std::operator+(&local_390,"\tt := &",&local_3b0);
  std::operator+(&local_370,&local_390,"{}\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::operator+=((string *)local_28,"\trcv.UnPackTo(t)\n");
  std::__cxx11::string::operator+=((string *)local_28,"\treturn t\n");
  std::__cxx11::string::operator+=((string *)local_28,"}\n\n");
  return;
}

Assistant:

void GenNativeStructUnPack(const StructDef &struct_def,
                             std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "func (rcv *" + namer_.Type(struct_def) + ") UnPackTo(t *" +
            NativeName(struct_def) + ") {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        code += "\tt." + namer_.Field(field) + " = rcv." +
                namer_.Method(field) + "(nil).UnPack()\n";
      } else {
        code += "\tt." + namer_.Field(field) + " = rcv." +
                namer_.Method(field) + "()\n";
      }
    }
    code += "}\n\n";

    code += "func (rcv *" + namer_.Type(struct_def) + ") UnPack() *" +
            NativeName(struct_def) + " {\n";
    code += "\tif rcv == nil {\n\t\treturn nil\n\t}\n";
    code += "\tt := &" + NativeName(struct_def) + "{}\n";
    code += "\trcv.UnPackTo(t)\n";
    code += "\treturn t\n";
    code += "}\n\n";
  }